

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::addCompElem(SimpleLoggerMgr *this,CompElem *elem)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_28;
  CompElem *local_18;
  
  local_18 = elem;
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->pendingCompElemsLock);
  std::__cxx11::list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>::
  push_back(&this->pendingCompElems,&local_18);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->cvCompressorLock);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void SimpleLoggerMgr::addCompElem(SimpleLoggerMgr::CompElem* elem) {
    {   std::unique_lock<std::mutex> l(pendingCompElemsLock);
        pendingCompElems.push_back(elem);
    }
    {   std::unique_lock<std::mutex> l(cvCompressorLock);
        cvCompressor.notify_all();
    }
}